

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockAgentTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::testutils::MockAgent_testSpanServer_Test::MockAgent_testSpanServer_Test
          (MockAgent_testSpanServer_Test *this)

{
  MockAgent_testSpanServer_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__MockAgent_testSpanServer_Test_003b2f80;
  return;
}

Assistant:

TEST(MockAgent, testSpanServer)
{
    std::shared_ptr<MockAgent> mockAgent = MockAgent::make();
    mockAgent->start();

    auto client = mockAgent->spanServerClient();

    constexpr auto kBiggestBatch = 5;
    for (auto i = 1; i < kBiggestBatch; ++i) {
        thrift::Batch batch;
        batch.spans.resize(i);
        for (auto j = 0; j < i; ++j) {
            std::string operationName("span-");
            operationName += std::to_string(j);
            batch.spans[j].__set_operationName(operationName);
        }

        client->emitBatch(batch);

        constexpr auto kNumTries = 100;
        for (auto k = 0; k < kNumTries; ++k) {
            std::this_thread::sleep_for(std::chrono::milliseconds(1));
            const auto batches = mockAgent->batches();
            if (!batches.empty() &&
                static_cast<int>(batches[0].spans.size()) == i) {
                break;
            }
        }

        const auto batches = mockAgent->batches();
        ASSERT_FALSE(batches.empty());
        ASSERT_EQ(i, static_cast<int>(batches[0].spans.size()));
        for (auto j = 0; j < i; ++j) {
            std::string operationName("span-");
            operationName += std::to_string(j);
            ASSERT_EQ(operationName, batches[0].spans[j].operationName);
        }
        mockAgent->resetBatches();
    }
}